

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_remove(REF_GEOM ref_geom,REF_INT geom)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_ADJ ref_adj;
  REF_INT geom_local;
  REF_GEOM ref_geom_local;
  
  if ((geom < 0) || (ref_geom->max <= geom)) {
    ref_geom_local._4_4_ = 3;
  }
  else if (ref_geom->descr[geom * 6] == -1) {
    ref_geom_local._4_4_ = 3;
  }
  else {
    ref_geom_local._4_4_ = ref_adj_remove(ref_geom->ref_adj,ref_geom->descr[geom * 6 + 5],geom);
    if (ref_geom_local._4_4_ == 0) {
      ref_geom->descr[geom * 6] = -1;
      ref_geom->descr[geom * 6 + 1] = ref_geom->blank;
      ref_geom->blank = geom;
      ref_geom->n = ref_geom->n + -1;
      ref_geom_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x235,
             "ref_geom_remove",(ulong)ref_geom_local._4_4_,"unregister geom");
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_remove(REF_GEOM ref_geom, REF_INT geom) {
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT node;

  if (geom < 0 || ref_geom_max(ref_geom) <= geom) return REF_INVALID;
  if (REF_EMPTY == ref_geom_type(ref_geom, geom)) return REF_INVALID;

  node = ref_geom_node(ref_geom, geom);
  RSS(ref_adj_remove(ref_adj, node, geom), "unregister geom");

  ref_geom_type(ref_geom, geom) = REF_EMPTY;
  ref_geom_id(ref_geom, geom) = ref_geom_blank(ref_geom);
  ref_geom_blank(ref_geom) = geom;
  ref_geom_n(ref_geom)--;

  return REF_SUCCESS;
}